

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<unsigned_long> * __thiscall
kj::ArrayBuilder<unsigned_long>::operator=
          (ArrayBuilder<unsigned_long> *this,ArrayBuilder<unsigned_long> *other)

{
  ArrayBuilder<unsigned_long> *other_local;
  ArrayBuilder<unsigned_long> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (unsigned_long *)0x0;
  other->pos = (RemoveConst<unsigned_long> *)0x0;
  other->endPtr = (unsigned_long *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }